

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void put_list_obj(char **dstp,vm_obj_id_t objval)

{
  vm_obj_id_t in_ESI;
  long *in_RDI;
  vm_val_t val;
  vm_val_t *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffe0,in_ESI);
  vmb_put_dh(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *in_RDI = *in_RDI + 5;
  return;
}

Assistant:

static void put_list_obj(char **dstp, vm_obj_id_t objval)
{
    vm_val_t val;

    /* set up the integer value */
    val.set_obj(objval);

    /* write it to the list */
    vmb_put_dh(*dstp, &val);

    /* advance the output pointer */
    *dstp += VMB_DATAHOLDER;
}